

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.h
# Opt level: O2

ssize_t hwrite(hFILE *fp,void *buffer,size_t nbytes)

{
  ssize_t sVar1;
  size_t __n;
  ulong uVar2;
  
  uVar2 = (long)fp->limit - (long)fp->begin;
  __n = nbytes;
  if (uVar2 < nbytes) {
    __n = uVar2;
  }
  memcpy(fp->begin,buffer,__n);
  fp->begin = fp->begin + __n;
  if (uVar2 < nbytes) {
    sVar1 = hwrite2(fp,buffer,nbytes,__n);
    return sVar1;
  }
  return __n;
}

Assistant:

static inline ssize_t HTS_RESULT_USED
hwrite(hFILE *fp, const void *buffer, size_t nbytes)
{
    extern ssize_t hwrite2(hFILE *, const void *, size_t, size_t);

    size_t n = fp->limit - fp->begin;
    if (n > nbytes) n = nbytes;
    memcpy(fp->begin, buffer, n);
    fp->begin += n;
    return (n==nbytes)? (ssize_t) n : hwrite2(fp, buffer, nbytes, n);
}